

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::UnicodeSet::applyIntPropertyValue
          (UnicodeSet *this,UCPMap *map,UCPMapValueFilter *filter,void *context,
          UErrorCode *errorCode)

{
  int end;
  UChar32 start;
  uint32_t value;
  uint32_t local_3c;
  UErrorCode *local_38;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  local_38 = errorCode;
  clear(this);
  start = 0;
  end = ucpmap_getRange_63(map,0,UCPMAP_RANGE_NORMAL,0,filter,context,&local_3c);
  while (-1 < end) {
    if (local_3c != 0) {
      add(this,start,end);
    }
    start = end + 1;
    end = ucpmap_getRange_63(map,start,UCPMAP_RANGE_NORMAL,0,filter,context,&local_3c);
  }
  if ((this->fFlags & 1) != 0) {
    *local_38 = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }